

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
* __thiscall
jessilib::vectorize_ntargs<char8_t,wchar_t>
          (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
           *__return_storage_ptr__,jessilib *this,wchar_t **in_ntarg_array)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_48;
  jessilib *local_28;
  wchar_t **argv;
  jessilib *local_18;
  wchar_t **in_ntarg_array_local;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  *result;
  
  argv._7_1_ = 0;
  local_18 = this;
  in_ntarg_array_local = (wchar_t **)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::vector(__return_storage_ptr__);
  if (local_18 != (jessilib *)0x0) {
    for (local_28 = local_18; *(long *)local_28 != 0; local_28 = local_28 + 8) {
      ntarg_cast<char8_t,_wchar_t,_nullptr>(&local_48,*(wchar_t **)local_28);
      std::vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>>::
      emplace_back<std::__cxx11::u8string>
                ((vector<std::__cxx11::u8string,std::allocator<std::__cxx11::u8string>> *)
                 __return_storage_ptr__,&local_48);
      std::__cxx11::u8string::~u8string((u8string *)&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::basic_string<OutCharT>> vectorize_ntargs(InCharT** in_ntarg_array) {
	std::vector<std::basic_string<OutCharT>> result;
	if (in_ntarg_array == nullptr) {
		return result;
	}

	for (auto argv = in_ntarg_array; *argv != nullptr; ++argv) {
		result.emplace_back(ntarg_cast<OutCharT, InCharT>(*argv));
	}

	return result;
}